

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_new_multiplicity::test_method(addrman_new_multiplicity *this)

{
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  bool bVar1;
  AddressPosition *pAVar2;
  long in_FS_OFFSET;
  uint i;
  AddressPosition addr_pos_multi;
  uint i_1;
  AddressPosition addr_pos;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> start_time;
  __single_object addrman;
  CNetAddr source_1;
  string addr_ip_1;
  CNetAddr source;
  string addr_ip;
  CAddress addr;
  char *in_stack_fffffffffffff958;
  direct_or_indirect *in_stack_fffffffffffff960;
  CAddress *in_stack_fffffffffffff968;
  _Optional_payload_base<bool> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  _Optional_payload_base<Network> in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff987;
  CAddress *in_stack_fffffffffffff988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  NodeContext *in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9a0;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  string *in_stack_fffffffffffff9b0;
  undefined1 *local_600;
  undefined8 in_stack_fffffffffffffa40;
  uint16_t port;
  undefined1 *local_558;
  uint local_4d8;
  undefined1 local_4c0 [8];
  undefined8 local_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [68];
  direct_or_indirect local_45c;
  undefined1 local_448 [68];
  undefined8 local_404;
  undefined8 local_3fc;
  duration local_3d0;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  undefined1 local_3b8 [8];
  undefined8 local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [68];
  direct_or_indirect local_354;
  undefined1 local_340 [68];
  undefined8 local_2fc;
  undefined8 local_2f4;
  uint local_2d0;
  uint local_2cc;
  duration local_2c8;
  allocator<char> local_2bd;
  int32_t local_2bc;
  optional<Network> local_2b0 [3];
  optional<Network> local_294 [3];
  undefined1 local_278 [56];
  undefined1 local_240 [192];
  undefined1 local_180 [56];
  undefined1 local_148 [304];
  duration local_18;
  long local_8;
  
  port = (uint16_t)((ulong)in_stack_fffffffffffffa40 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2bc = GetCheckRatio(in_stack_fffffffffffff998);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_fffffffffffff990,(bool *)in_stack_fffffffffffff988,
             (int *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),in_stack_fffffffffffff9a0
             ,(allocator<char> *)in_stack_fffffffffffff998);
  ResolveService((string *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),port);
  CAddress::CAddress(in_stack_fffffffffffff988,
                     (CService *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                     (ServiceFlags)in_stack_fffffffffffff978);
  CService::~CService((CService *)in_stack_fffffffffffff958);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_2bd);
  local_2c8.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_18.__r = local_2c8.__r;
  for (local_4d8 = 1; local_4d8 < 0x14; local_4d8 = local_4d8 + 1) {
    local_2cc = local_4d8 & 0xff;
    util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff990);
    std::operator+(in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968);
    local_2d0 = local_4d8 >> 8;
    util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff990);
    std::operator+(in_stack_fffffffffffff990,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff988);
    std::operator+(in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    ResolveIP(in_stack_fffffffffffff9b0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff958);
    CAddress::CAddress(in_stack_fffffffffffff968,
                       (CAddress *)&in_stack_fffffffffffff960->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff958);
    __l._M_len._0_7_ = in_stack_fffffffffffff9a8;
    __l._M_array = (iterator)in_stack_fffffffffffff9a0;
    __l._M_len._7_1_ = in_stack_fffffffffffff9af;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff998,__l,
               (allocator_type *)in_stack_fffffffffffff990);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff968,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_fffffffffffff960->indirect_contents,(CNetAddr *)in_stack_fffffffffffff958
                 ,(seconds)in_stack_fffffffffffff978);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff968);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff958);
    local_558 = local_148;
    do {
      local_558 = local_558 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff958);
    } while (local_558 != local_180);
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff958);
  AddrMan::FindAddressEntry
            ((AddrMan *)in_stack_fffffffffffff968,
             (CAddress *)&in_stack_fffffffffffff960->indirect_contents);
  pAVar2 = std::optional<AddressPosition>::value
                     ((optional<AddressPosition> *)in_stack_fffffffffffff968);
  local_2fc._0_1_ = pAVar2->tried;
  local_2fc._1_3_ = *(undefined3 *)&pAVar2->field_0x1;
  local_2fc._4_4_ = pAVar2->multiplicity;
  local_2f4._0_4_ = pAVar2->bucket;
  local_2f4._4_4_ = pAVar2->position;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff998,
               (const_string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff960->indirect_contents,
               (char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    local_354._0_4_ = 1;
    in_stack_fffffffffffff968 = (CAddress *)0x1bc11bb;
    in_stack_fffffffffffff960 = &local_354;
    in_stack_fffffffffffff958 = "addr_pos.multiplicity";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
              (local_340,local_354.direct + 4,0x14a,1,2,(long)&local_2fc + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff998,
               (const_string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff960->indirect_contents,
               (char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    _Var3 = SUB82((ulong)in_stack_fffffffffffff968 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff958);
    std::optional<Network>::optional(local_294);
    std::optional<bool>::optional((optional<bool> *)(local_3b8 + 6));
    local_3b0 = AddrMan::Size((AddrMan *)&in_stack_fffffffffffff960->indirect_contents,
                              (optional<Network>)in_stack_fffffffffffff978,(optional<bool>)_Var3);
    local_3b8._0_4_ = 1;
    in_stack_fffffffffffff968 = (CAddress *)0x1bc11bb;
    in_stack_fffffffffffff960 = (direct_or_indirect *)local_3b8;
    in_stack_fffffffffffff958 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_398,local_3a8,0x14b,1,2,&local_3b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_3bc = 1; local_3bc < 400; local_3bc = local_3bc + 1) {
    local_3c0 = local_3bc & 0xff;
    util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff990);
    std::operator+(in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968);
    local_3c4 = local_3bc >> 8;
    util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff990);
    std::operator+(in_stack_fffffffffffff990,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff988);
    std::operator+(in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
    ResolveIP(in_stack_fffffffffffff9b0);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_int,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff958,(uint *)0x303ff2);
    local_3d0.__r =
         (rep)std::chrono::operator+
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )&in_stack_fffffffffffff960->indirect_contents,
                         (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff958);
    local_18.__r = local_3d0.__r;
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff958);
    CAddress::CAddress(in_stack_fffffffffffff968,
                       (CAddress *)&in_stack_fffffffffffff960->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff958);
    __l_00._M_len._0_7_ = in_stack_fffffffffffff9a8;
    __l_00._M_array = (iterator)in_stack_fffffffffffff9a0;
    __l_00._M_len._7_1_ = in_stack_fffffffffffff9af;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff998,__l_00,
               (allocator_type *)in_stack_fffffffffffff990);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff968,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_fffffffffffff960->indirect_contents,(CNetAddr *)in_stack_fffffffffffff958
                 ,(seconds)in_stack_fffffffffffff978);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff968);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff958);
    local_600 = local_240;
    do {
      local_600 = local_600 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff958);
    } while (local_600 != local_278);
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff958);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff958);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff958);
  AddrMan::FindAddressEntry
            ((AddrMan *)in_stack_fffffffffffff968,
             (CAddress *)&in_stack_fffffffffffff960->indirect_contents);
  pAVar2 = std::optional<AddressPosition>::value
                     ((optional<AddressPosition> *)in_stack_fffffffffffff968);
  local_404._0_1_ = pAVar2->tried;
  local_404._1_3_ = *(undefined3 *)&pAVar2->field_0x1;
  local_404._4_4_ = pAVar2->multiplicity;
  local_3fc._0_4_ = pAVar2->bucket;
  local_3fc._4_4_ = pAVar2->position;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff998,
               (const_string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff960->indirect_contents,
               (char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    local_45c._0_4_ = 8;
    in_stack_fffffffffffff968 = (CAddress *)0x1bf4118;
    in_stack_fffffffffffff960 = &local_45c;
    in_stack_fffffffffffff958 = "addr_pos_multi.multiplicity";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
              (local_448,local_45c.direct + 4,0x157,1,2,(long)&local_404 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff998,
               (const_string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    in_stack_fffffffffffff998 = (NodeContext *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff960->indirect_contents,
               (char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
               in_stack_fffffffffffff960->direct,(unsigned_long)in_stack_fffffffffffff958);
    _Var3 = SUB82((ulong)in_stack_fffffffffffff968 >> 0x30,0);
    in_stack_fffffffffffff988 =
         (CAddress *)
         std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
                   ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff958)
    ;
    std::optional<Network>::optional(local_2b0);
    std::optional<bool>::optional((optional<bool> *)(local_4c0 + 6));
    in_stack_fffffffffffff990 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AddrMan::Size((AddrMan *)&in_stack_fffffffffffff960->indirect_contents,
                       (optional<Network>)in_stack_fffffffffffff978,(optional<bool>)_Var3);
    local_4c0._0_4_ = 1;
    in_stack_fffffffffffff968 = (CAddress *)0x1bc11bb;
    in_stack_fffffffffffff960 = (direct_or_indirect *)local_4c0;
    in_stack_fffffffffffff958 = "addrman->Size()";
    local_4b8 = in_stack_fffffffffffff990;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_4a0,local_4b0,0x159,1,2,&local_4b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    in_stack_fffffffffffff987 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff987);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff958);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff968);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_new_multiplicity)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CAddress addr{CAddress(ResolveService("253.3.3.3", 8333), NODE_NONE)};
    const auto start_time{Now<NodeSeconds>()};
    addr.nTime = start_time;

    // test that multiplicity stays at 1 if nTime doesn't increase
    for (unsigned int i = 1; i < 20; ++i) {
        std::string addr_ip{ToString(i % 256) + "." + ToString(i >> 8 % 256) + ".1.1"};
        CNetAddr source{ResolveIP(addr_ip)};
        addrman->Add({addr}, source);
    }
    AddressPosition addr_pos = addrman->FindAddressEntry(addr).value();
    BOOST_CHECK_EQUAL(addr_pos.multiplicity, 1U);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // if nTime increases, an addr can occur in up to 8 buckets
    // The acceptance probability decreases exponentially with existing multiplicity -
    // choose number of iterations such that it gets to 8 with deterministic addrman.
    for (unsigned int i = 1; i < 400; ++i) {
        std::string addr_ip{ToString(i % 256) + "." + ToString(i >> 8 % 256) + ".1.1"};
        CNetAddr source{ResolveIP(addr_ip)};
        addr.nTime = start_time + std::chrono::seconds{i};
        addrman->Add({addr}, source);
    }
    AddressPosition addr_pos_multi = addrman->FindAddressEntry(addr).value();
    BOOST_CHECK_EQUAL(addr_pos_multi.multiplicity, 8U);
    // multiplicity doesn't affect size
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
}